

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser2_syntax.c
# Opt level: O2

RK_S32 vp9d_parser2_syntax(Vp9CodecContext *ctx)

{
  UCHAR (*paaUVar1) [4] [3];
  RK_U8 (*paaRVar2) [4] [3];
  RK_U8 (*paaRVar3) [4] [3];
  DXVA_PicEntry_VPx DVar4;
  void *pvVar5;
  ushort uVar6;
  RK_S32 RVar7;
  UCHAR UVar8;
  byte bVar9;
  byte bVar10;
  ushort uVar11;
  RK_U32 RVar12;
  byte *pbVar13;
  byte bVar14;
  byte bVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  uint uVar22;
  RK_U8 (*paRVar23) [9];
  UCHAR (*paUVar24) [9];
  ulong uVar25;
  RK_U8 (*paRVar26) [9];
  UCHAR (*paUVar27) [9];
  long lVar28;
  undefined8 *puVar29;
  bool bVar30;
  byte bVar31;
  undefined1 auVar32 [16];
  RK_U8 partition_probs_delata [16] [3];
  RK_U8 partition_probs_flag [16] [3];
  RK_U8 partition_probs [16] [3];
  RK_U8 uv_mode_prob [10] [9];
  
  bVar31 = 0;
  pvVar5 = ctx->priv_data;
  (ctx->pic_params).profile = (UCHAR)ctx->profile;
  uVar11 = (ctx->pic_params).field_2.wFormatAndPictureInfoFlags;
  uVar16 = (*(byte *)((long)pvVar5 + 0xd0) & 1) << 0xe;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar11 & 0xbfff | uVar16;
  bVar30 = *(char *)((long)pvVar5 + 0xd1) == '\0';
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar11 & 0xbffe | uVar16 | (ushort)bVar30;
  uVar11 = (uVar11 & 0xbffc | uVar16 | (ushort)bVar30) +
           (ushort)(*(char *)((long)pvVar5 + 0xd7) == '\0') * 2;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar11;
  uVar11 = (uVar11 & 0xfffb) + (*(byte *)((long)pvVar5 + 0xd9) & 1) * 4;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar11;
  uVar11 = (uVar11 & 0xfff7) + (*(byte *)((long)pvVar5 + 0xda) & 1) * 8;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar11;
  uVar17 = (*(byte *)((long)pvVar5 + 0xdb) & 1) << 4;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar11 & 0xffef | uVar17;
  uVar16 = (ushort)((*(uint *)((long)pvVar5 + 0xdc) & 1) << 5);
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar11 & 0xffcf | uVar17 | uVar16;
  uVar18 = (*(byte *)((long)pvVar5 + 0xea) & 1) << 6;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar11 & 0xff8f | uVar17 | uVar16 | uVar18;
  bVar14 = *(char *)((long)pvVar5 + 0xdd) << 7;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar11 & 0xff0f | uVar17 | uVar16 | uVar18 | (ushort)bVar14;
  uVar19 = (*(byte *)((long)pvVar5 + 0xec) & 3) << 8;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar11 & 0xfc0f | uVar17 | uVar16 | uVar18 | (ushort)bVar14 | uVar19;
  uVar20 = (*(byte *)((long)pvVar5 + 0xde) & 3) << 10;
  uVar6 = (ushort)bVar14;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar11 & 0xf00f | uVar17 | uVar16 | uVar18 | uVar6 | uVar19 | uVar20;
  uVar21 = (*(byte *)((long)pvVar5 + 0xe0) & 1) << 0xc;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar11 & 0xe00f | uVar17 | uVar16 | uVar18 | uVar6 | uVar19 | uVar20 | uVar21;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar11 & 0xc00f | uVar17 | uVar16 | uVar18 | uVar6 | uVar19 | uVar20 | uVar21 |
       (*(byte *)((long)pvVar5 + 0xeb) & 1) << 0xd;
  RVar7 = ctx->height;
  (ctx->pic_params).width = ctx->width;
  (ctx->pic_params).height = RVar7;
  UVar8 = *(char *)((long)pvVar5 + 0xd4) + 0xf8;
  (ctx->pic_params).BitDepthMinus8Luma = UVar8;
  (ctx->pic_params).BitDepthMinus8Chroma = UVar8;
  (ctx->pic_params).interp_filter = *(UCHAR *)((long)pvVar5 + 0xe4);
  (ctx->pic_params).CurrPic.field_0.bPicEntry =
       (ctx->pic_params).CurrPic.field_0.bPicEntry & 0x80 | *(byte *)((long)pvVar5 + 0x100) & 0x7f;
  puVar29 = (undefined8 *)((long)pvVar5 + 0x140);
  for (lVar28 = 0; lVar28 != 8; lVar28 = lVar28 + 1) {
    (ctx->pic_params).ref_frame_map[lVar28].field_0 =
         (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
         ((ctx->pic_params).ref_frame_map[lVar28].field_0.bPicEntry & 0x80 |
         *(byte *)(puVar29 + 1) & 0x7f);
    RVar12 = mpp_frame_get_width((MppFrame)*puVar29);
    (ctx->pic_params).ref_frame_coded_width[lVar28] = RVar12;
    RVar12 = mpp_frame_get_height((MppFrame)*puVar29);
    (ctx->pic_params).ref_frame_coded_height[lVar28] = RVar12;
    puVar29 = puVar29 + 3;
  }
  DVar4.field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
       (ctx->pic_params).frame_refs[1].field_0.bPicEntry;
  (ctx->pic_params).frame_refs[0].field_0.bPicEntry =
       (ctx->pic_params).frame_refs[0].field_0.bPicEntry & 0x80 |
       *(byte *)((long)pvVar5 + 0xed) & 0x7f;
  (ctx->pic_params).frame_refs[1].field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
       ((byte)DVar4.field_0 & 0x80 | *(byte *)((long)pvVar5 + 0xee) & 0x7f);
  (ctx->pic_params).frame_refs[2].field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
       ((ctx->pic_params).frame_refs[2].field_0.bPicEntry & 0x80 |
       *(byte *)((long)pvVar5 + 0xef) & 0x7f);
  (ctx->pic_params).ref_frame_sign_bias[1] = *(CHAR *)((long)pvVar5 + 0xf0);
  (ctx->pic_params).ref_frame_sign_bias[2] = *(CHAR *)((long)pvVar5 + 0xf1);
  (ctx->pic_params).ref_frame_sign_bias[3] = *(CHAR *)((long)pvVar5 + 0xf2);
  (ctx->pic_params).filter_level = *(CHAR *)((long)pvVar5 + 0x204);
  (ctx->pic_params).sharpness_level = *(CHAR *)((long)pvVar5 + 0x205);
  bVar14 = (ctx->pic_params).field_16.wControlInfoFlags;
  bVar9 = *(byte *)((long)pvVar5 + 0x286) & 1;
  (ctx->pic_params).field_16.wControlInfoFlags = bVar14 & 0xfe | bVar9;
  bVar10 = *(char *)((long)pvVar5 + 0x287) * '\x02' & 2;
  (ctx->pic_params).field_16.wControlInfoFlags = bVar14 & 0xfc | bVar9 | bVar10;
  (ctx->pic_params).field_16.wControlInfoFlags =
       bVar14 & 0xf8 | bVar9 | bVar10 | (*(byte *)((long)pvVar5 + 0xd8) & 1) << 2;
  (ctx->pic_params).ref_deltas[0] = *(CHAR *)((long)pvVar5 + 0x28a);
  (ctx->pic_params).ref_deltas[1] = *(CHAR *)((long)pvVar5 + 0x28b);
  (ctx->pic_params).ref_deltas[2] = *(CHAR *)((long)pvVar5 + 0x28c);
  (ctx->pic_params).ref_deltas[3] = *(CHAR *)((long)pvVar5 + 0x28d);
  (ctx->pic_params).mode_deltas[0] = *(CHAR *)((long)pvVar5 + 0x288);
  (ctx->pic_params).mode_deltas[1] = *(CHAR *)((long)pvVar5 + 0x289);
  (ctx->pic_params).base_qindex = (ushort)*(byte *)((long)pvVar5 + 0x28e);
  (ctx->pic_params).y_dc_delta_q = *(CHAR *)((long)pvVar5 + 0x28f);
  (ctx->pic_params).uv_dc_delta_q = *(CHAR *)((long)pvVar5 + 0x290);
  (ctx->pic_params).uv_ac_delta_q = *(CHAR *)((long)pvVar5 + 0x291);
  (ctx->pic_params).txmode = *(CHAR *)((long)pvVar5 + 0x6f10);
  (ctx->pic_params).refmode = *(CHAR *)((long)pvVar5 + 0x6f14);
  bVar14 = (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags;
  bVar9 = *(byte *)((long)pvVar5 + 0x294) & 1;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags = bVar14 & 0xfe | bVar9;
  bVar10 = *(char *)((long)pvVar5 + 0x297) * '\x02' & 2;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags = bVar14 & 0xfc | bVar9 | bVar10;
  bVar15 = (*(byte *)((long)pvVar5 + 0x295) & 1) << 2;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags =
       bVar14 & 0xf8 | bVar9 | bVar10 | bVar15;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags =
       (*(byte *)((long)pvVar5 + 0x296) & 1) << 3 | bVar9 | bVar10 | bVar15;
  for (lVar28 = 0; lVar28 != 7; lVar28 = lVar28 + 1) {
    (ctx->pic_params).stVP9Segments.tree_probs[lVar28] = *(UCHAR *)((long)pvVar5 + lVar28 + 0x2b6f);
  }
  (ctx->pic_params).stVP9Segments.pred_probs[0] = *(UCHAR *)((long)pvVar5 + 0x2b76);
  (ctx->pic_params).stVP9Segments.pred_probs[1] = *(UCHAR *)((long)pvVar5 + 0x2b77);
  (ctx->pic_params).stVP9Segments.pred_probs[2] = *(UCHAR *)((long)pvVar5 + 0x2b78);
  pbVar13 = (byte *)((long)pvVar5 + 0x29a);
  for (lVar28 = -8; lVar28 != 0; lVar28 = lVar28 + 1) {
    *(undefined2 *)((ctx->pic_params).stVP9Segments.feature_mask + lVar28 * 8) =
         *(undefined2 *)(pbVar13 + 6);
    *(short *)((long)((ctx->pic_params).prob.y_mode + -3) + 7 + lVar28 * 8) =
         (short)(char)pbVar13[8];
    *(ushort *)((long)((ctx->pic_params).prob.y_mode + -2) + lVar28 * 8) = (ushort)pbVar13[4];
    bVar14 = pbVar13[3];
    *(ushort *)((long)((ctx->pic_params).prob.y_mode + -2) + 2 + lVar28 * 8) = (ushort)bVar14;
    *(byte *)((long)((ctx->pic_params).prob.y_mode + -2) + 4 + lVar28) =
         bVar14 * '\b' | *pbVar13 | pbVar13[2] << 2 | pbVar13[1] * '\x02';
    pbVar13 = pbVar13 + 0x1a;
  }
  (ctx->pic_params).log2_tile_cols = *(UCHAR *)((long)pvVar5 + 0x36c);
  (ctx->pic_params).log2_tile_rows = *(UCHAR *)((long)pvVar5 + 0x370);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)((long)pvVar5 + 0x709c);
  auVar32 = pshuflw(auVar32,auVar32,0xe8);
  (ctx->pic_params).uncompressed_header_size_byte_aligned = (short)auVar32._0_4_;
  (ctx->pic_params).first_partition_size = (short)((uint)auVar32._0_4_ >> 0x10);
  *(undefined8 *)(ctx->pic_params).mvscale = *(undefined8 *)((long)pvVar5 + 0x7088);
  (ctx->pic_params).mvscale[2] = *(USHORT (*) [2])((long)pvVar5 + 0x7090);
  memcpy(&(ctx->pic_params).prob,(void *)((long)pvVar5 + 0x2378),0x7f7);
  memcpy(&(ctx->pic_params).prob_flag_delta,(void *)((long)pvVar5 + 0x2b79),0xfee);
  paaUVar1 = (ctx->pic_params).prob.partition;
  paaRVar2 = (ctx->pic_params).prob_flag_delta.p_flag.partition;
  paaRVar3 = (ctx->pic_params).prob_flag_delta.p_delta.partition;
  lVar28 = 0;
  for (uVar22 = 3; -1 < (int)uVar22; uVar22 = uVar22 - 1) {
    uVar25 = (ulong)uVar22;
    *(undefined4 *)(partition_probs[2] + lVar28 + 2) =
         *(undefined4 *)((ctx->pic_params).prob.partition[uVar25][2] + 2);
    *(undefined8 *)(partition_probs[0] + lVar28) = *(undefined8 *)paaUVar1[uVar25];
    *(undefined8 *)(partition_probs_flag[0] + lVar28) = *(undefined8 *)paaRVar2[uVar25];
    *(undefined4 *)(partition_probs_flag[2] + lVar28 + 2) =
         *(undefined4 *)
          ((long)(ctx->pic_params).prob_flag_delta.p_delta.y_mode + uVar25 * 0xc + -0x28);
    *(undefined8 *)(partition_probs_delata[0] + lVar28) = *(undefined8 *)paaRVar3[uVar25];
    *(undefined4 *)(partition_probs_delata[2] + lVar28 + 2) =
         *(undefined4 *)
          ((long)((ctx->pic_params).prob_flag_delta.coef_flag + -1) + uVar25 * 0xc + 0x188);
    lVar28 = lVar28 + 0xc;
  }
  *(undefined8 *)((ctx->pic_params).prob.partition[2][2] + 2) = partition_probs._32_8_;
  *(undefined8 *)((ctx->pic_params).prob.partition[3][1] + 1) = partition_probs._40_8_;
  *(undefined8 *)((ctx->pic_params).prob.partition[1][1] + 1) = partition_probs._16_8_;
  *(undefined8 *)(ctx->pic_params).prob.partition[2] = partition_probs._24_8_;
  *(undefined8 *)*paaUVar1 = partition_probs._0_8_;
  *(undefined8 *)((ctx->pic_params).prob.partition[0][2] + 2) = partition_probs._8_8_;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[2][2] + 2) =
       partition_probs_flag._32_8_;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[3][1] + 1) =
       partition_probs_flag._40_8_;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[1][1] + 1) =
       partition_probs_flag._16_8_;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_flag.partition[2] = partition_probs_flag._24_8_
  ;
  *(undefined8 *)*paaRVar2 = partition_probs_flag._0_8_;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[0][2] + 2) =
       partition_probs_flag._8_8_;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[2][2] + 2) =
       partition_probs_delata._32_8_;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[3][1] + 1) =
       partition_probs_delata._40_8_;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[1][1] + 1) =
       partition_probs_delata._16_8_;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_delta.partition[2] =
       partition_probs_delata._24_8_;
  *(undefined8 *)*paaRVar3 = partition_probs_delata._0_8_;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[0][2] + 2) =
       partition_probs_delata._8_8_;
  paUVar24 = (ctx->pic_params).prob.uv_mode;
  lVar28 = 0;
  for (uVar25 = 0; uVar25 != 10; uVar25 = uVar25 + 1) {
    paUVar27 = (ctx->pic_params).prob.uv_mode + 2;
    switch(uVar25 & 0xffffffff) {
    case 0:
      break;
    case 1:
      paUVar27 = paUVar24;
      break;
    case 2:
      paUVar27 = (ctx->pic_params).prob.uv_mode + 1;
      break;
    default:
      paUVar27 = (UCHAR (*) [9])(*paUVar24 + lVar28);
      break;
    case 7:
      paUVar27 = (ctx->pic_params).prob.uv_mode + 8;
      break;
    case 8:
      paUVar27 = (ctx->pic_params).prob.uv_mode + 7;
    }
    uv_mode_prob[0][lVar28 + 8] = (*paUVar27)[8];
    *(undefined8 *)(uv_mode_prob[0] + lVar28) = *(undefined8 *)*paUVar27;
    lVar28 = lVar28 + 9;
  }
  paRVar23 = uv_mode_prob;
  for (lVar28 = 0x5a; lVar28 != 0; lVar28 = lVar28 + -1) {
    (*paUVar24)[0] = (*paRVar23)[0];
    paRVar23 = (RK_U8 (*) [9])((long)paRVar23 + (ulong)bVar31 * -2 + 1);
    paUVar24 = (UCHAR (*) [9])((long)paUVar24 + (ulong)bVar31 * -2 + 1);
  }
  paRVar23 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode;
  lVar28 = 0;
  for (uVar25 = 0; uVar25 != 10; uVar25 = uVar25 + 1) {
    paRVar26 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 2;
    switch(uVar25 & 0xffffffff) {
    case 0:
      break;
    case 1:
      paRVar26 = paRVar23;
      break;
    case 2:
      paRVar26 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 1;
      break;
    default:
      paRVar26 = (RK_U8 (*) [9])(*paRVar23 + lVar28);
      break;
    case 7:
      paRVar26 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 8;
      break;
    case 8:
      paRVar26 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 7;
    }
    uv_mode_prob[0][lVar28 + 8] = (*paRVar26)[8];
    *(undefined8 *)(uv_mode_prob[0] + lVar28) = *(undefined8 *)*paRVar26;
    lVar28 = lVar28 + 9;
  }
  memcpy(paRVar23,uv_mode_prob,0x5a);
  paRVar23 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode;
  lVar28 = 0;
  for (uVar25 = 0; uVar25 != 10; uVar25 = uVar25 + 1) {
    paRVar26 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 2;
    switch(uVar25 & 0xffffffff) {
    case 0:
      break;
    case 1:
      paRVar26 = paRVar23;
      break;
    case 2:
      paRVar26 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 1;
      break;
    default:
      paRVar26 = (RK_U8 (*) [9])(*paRVar23 + lVar28);
      break;
    case 7:
      paRVar26 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 8;
      break;
    case 8:
      paRVar26 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 7;
    }
    uv_mode_prob[0][lVar28 + 8] = (*paRVar26)[8];
    *(undefined8 *)(uv_mode_prob[0] + lVar28) = *(undefined8 *)*paRVar26;
    lVar28 = lVar28 + 9;
  }
  memcpy(paRVar23,uv_mode_prob,0x5a);
  return 0;
}

Assistant:

RK_S32 vp9d_parser2_syntax(Vp9CodecContext *ctx)
{
    vp9d_fill_picparams(ctx, &ctx->pic_params);
    return 0;
}